

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::doubletonEq
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row,RowType rowType)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  undefined4 in_ECX;
  int in_EDX;
  HPresolve *in_RSI;
  long *in_RDI;
  double dVar6;
  HighsCDouble HVar7;
  Result __result;
  bool upperTightened;
  bool lowerTightened;
  double stayImplUpper;
  double stayImplLower;
  double substUpper;
  double substLower;
  double oldStayUpper;
  double oldStayLower;
  double roundRhs;
  double roundCoef;
  double rhs;
  double staycoef;
  double substcoef;
  HighsInt staycol;
  HighsInt substcol;
  anon_class_24_3_1a3218a6 colAtPos1Better;
  HighsInt nzPos2;
  HighsInt nzPos1;
  bool logging_on;
  undefined4 in_stack_fffffffffffffdc8;
  HighsInt in_stack_fffffffffffffdcc;
  HighsCDouble *in_stack_fffffffffffffdd0;
  HPresolve *pHVar8;
  undefined6 in_stack_fffffffffffffde0;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined4 in_stack_fffffffffffffdf0;
  value_type col;
  pointer scale;
  pointer offset;
  undefined8 in_stack_fffffffffffffe28;
  value_type vVar11;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  pointer in_stack_fffffffffffffe38;
  HighsInt rule_type;
  HighsPostsolveStack *in_stack_fffffffffffffe40;
  anon_class_24_3_1a3218a6 *in_stack_fffffffffffffe48;
  HighsPostsolveStack *in_stack_fffffffffffffe50;
  value_type vVar12;
  HighsInt in_stack_fffffffffffffe6c;
  HPresolve *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffea8 [16];
  unkbyte10 Var13;
  HighsCDouble in_stack_fffffffffffffeb8;
  pointer in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  HighsCDouble in_stack_fffffffffffffed8;
  HighsCDouble in_stack_fffffffffffffee8;
  RowType in_stack_ffffffffffffff00;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff08;
  HighsCDouble local_e8;
  HighsCDouble local_d8;
  HighsCDouble local_c8;
  HighsCDouble local_b8;
  pointer local_a8;
  HighsPostsolveStack *local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  HPresolve *local_58;
  value_type local_50;
  value_type local_4c;
  int *local_40;
  int *local_38;
  int local_2c;
  int local_28;
  byte local_21;
  undefined4 local_20;
  int local_1c;
  HPresolve *local_18;
  Result local_4;
  
  Var13 = in_stack_fffffffffffffea8._6_10_;
  local_21 = *(byte *)((long)in_RDI + 0x691) & 1;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  if (local_21 != 0) {
    HPresolveAnalysis::startPresolveRuleLog
              ((HPresolveAnalysis *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (HighsInt)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x17),(long)local_1c);
  local_28 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d),(long)local_28);
  if (*pvVar3 == -1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_28);
    vVar12 = *pvVar3;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d),(long)local_28);
    vVar12 = *pvVar3;
  }
  local_40 = &local_28;
  local_38 = &local_2c;
  local_2c = vVar12;
  bVar1 = doubletonEq::anon_class_24_3_1a3218a6::operator()(in_stack_fffffffffffffe48);
  if (bVar1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_28);
    local_4c = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_2c);
    local_50 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_28);
    local_58 = (HPresolve *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_2c);
    local_60 = (pointer)*pvVar4;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_2c);
    local_4c = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_28);
    local_50 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_2c);
    local_58 = (HPresolve *)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_28);
    local_60 = (pointer)*pvVar4;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)local_1c);
  local_68 = (pointer)*pvVar4;
  pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                     ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                      (long)local_4c);
  if ((*pvVar5 == kInteger) &&
     (pvVar5 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                          (long)local_50), *pvVar5 == kInteger)) {
    dVar6 = round((double)local_60 / (double)local_58);
    local_70 = (pointer)(dVar6 * (double)local_58);
    if (*(double *)(in_RDI[1] + 0x108) <= ABS((double)local_70 - (double)local_60) &&
        ABS((double)local_70 - (double)local_60) != *(double *)(in_RDI[1] + 0x108)) {
      return kOk;
    }
    local_60 = local_70;
    dVar6 = round((double)local_68 / (double)local_58);
    local_78 = (pointer)(dVar6 * (double)local_58);
    dVar6 = (double)local_68 - (double)local_78;
    local_68 = local_78;
    if ((double)in_RDI[4] <= ABS(dVar6) && ABS(dVar6) != (double)in_RDI[4]) {
      return kPrimalInfeasible;
    }
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_50);
  local_80 = (pointer)*pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_50);
  local_88 = (pointer)*pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_4c);
  local_90 = (pointer)*pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_4c);
  local_98 = (pointer)*pvVar4;
  bVar1 = std::signbit((double)local_58);
  uVar2 = (uint)bVar1;
  bVar1 = std::signbit((double)local_60);
  if (uVar2 == bVar1) {
    if (((double)local_98 != INFINITY) || (NAN((double)local_98))) {
      HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xfffffffffffffec8,(double)local_68);
      in_stack_fffffffffffffed8 =
           HighsCDouble::operator-
                     (in_stack_fffffffffffffdd0,
                      (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffee8 =
           HighsCDouble::operator/
                     ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                      3.62508661840821e-317);
      in_stack_fffffffffffffe40 =
           (HighsPostsolveStack *)
           HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xfffffffffffffee8);
    }
    else {
      in_stack_fffffffffffffe40 = (HighsPostsolveStack *)0xfff0000000000000;
    }
    local_a0 = in_stack_fffffffffffffe40;
    if (((double)local_90 != -INFINITY) || (NAN((double)local_90))) {
      HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xfffffffffffffe98,(double)local_68);
      HVar7 = HighsCDouble::operator-
                        (in_stack_fffffffffffffdd0,
                         (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      Var13 = HVar7._6_10_;
      in_stack_fffffffffffffeb8 =
           HighsCDouble::operator/
                     ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                      3.62517999681527e-317);
      in_stack_fffffffffffffe38 =
           (pointer)HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xfffffffffffffeb8);
      local_a8 = in_stack_fffffffffffffe38;
    }
    else {
      in_stack_fffffffffffffe38 = (pointer)0x7ff0000000000000;
      local_a8 = in_stack_fffffffffffffe38;
    }
  }
  else {
    if (((double)local_90 != -INFINITY) || (NAN((double)local_90))) {
      HighsCDouble::HighsCDouble(&local_d8,(double)local_68);
      local_c8 = HighsCDouble::operator-
                           (in_stack_fffffffffffffdd0,
                            (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_b8 = HighsCDouble::operator/
                           ((HighsCDouble *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                            3.62488998028116e-317);
      in_stack_fffffffffffffe50 =
           (HighsPostsolveStack *)HighsCDouble::operator_cast_to_double(&local_b8);
    }
    else {
      in_stack_fffffffffffffe50 = (HighsPostsolveStack *)0xfff0000000000000;
    }
    local_a0 = in_stack_fffffffffffffe50;
    if (((double)local_98 != INFINITY) || (NAN((double)local_98))) {
      HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xfffffffffffffef8,(double)local_68);
      HVar7 = HighsCDouble::operator-
                        (in_stack_fffffffffffffdd0,
                         (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      in_stack_ffffffffffffff08 = (HighsMatrixSlice<HighsTripletListSlice> *)HVar7.hi;
      local_e8 = HighsCDouble::operator/
                           ((HighsCDouble *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                            3.62498780527904e-317);
      local_a8 = (pointer)HighsCDouble::operator_cast_to_double(&local_e8);
    }
    else {
      local_a8 = (pointer)0x7ff0000000000000;
    }
  }
  rule_type = (HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  uVar9 = (double)local_80 + (double)in_RDI[4] < (double)local_a0;
  if ((bool)uVar9) {
    changeColLower(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(double)in_RDI);
  }
  uVar10 = (double)local_a8 < (double)local_88 - (double)in_RDI[4];
  if ((bool)uVar10) {
    changeColUpper(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(double)in_RDI);
  }
  col = local_50;
  pHVar8 = local_58;
  scale = local_90;
  offset = local_98;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)local_4c);
  vVar11 = *pvVar4;
  getColumnVector(pHVar8,col);
  pHVar8 = (HPresolve *)&stack0xfffffffffffffe70;
  HighsPostsolveStack::doubletonEquation<HighsTripletListSlice>
            ((HighsPostsolveStack *)in_stack_fffffffffffffee8.lo,in_stack_fffffffffffffee8.hi._4_4_,
             in_stack_fffffffffffffee8.hi._0_4_,in_stack_fffffffffffffed8.lo._4_4_,
             (double)in_stack_fffffffffffffed8.hi,(double)in_stack_fffffffffffffed0,
             (double)in_stack_fffffffffffffec8,(double)in_stack_fffffffffffffeb8.lo,
             (double)in_stack_fffffffffffffeb8.hi,(double)SUB108(Var13,2),SUB101(Var13,1),
             SUB101(Var13,0),in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  markColDeleted(pHVar8,in_stack_fffffffffffffdcc);
  removeRow((HPresolve *)CONCAT44(local_1c,in_stack_fffffffffffffdf0),
            (HighsInt)((ulong)local_18 >> 0x20));
  substitute((HPresolve *)CONCAT44(local_20,in_stack_fffffffffffffe30),
             (HighsInt)((ulong)vVar11 >> 0x20),SUB84(vVar11,0),(double)offset,(double)scale);
  *(byte *)((long)in_RDI + 0x691) = local_21 & 1;
  if ((local_21 & 1) != 0) {
    HPresolveAnalysis::stopPresolveRuleLog((HPresolveAnalysis *)in_stack_fffffffffffffe40,rule_type)
    ;
  }
  local_4 = removeRowSingletons(local_18,(HighsPostsolveStack *)
                                         CONCAT17(uVar10,CONCAT16(uVar9,in_stack_fffffffffffffde0)))
  ;
  if (local_4 == kOk) {
    local_4 = checkLimits((HPresolve *)CONCAT44(vVar12,uVar2),in_stack_fffffffffffffe50);
  }
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::doubletonEq(HighsPostsolveStack& postsolve_stack,
                                         HighsInt row,
                                         HighsPostsolveStack::RowType rowType) {
  assert(analysis_.allow_rule_[kPresolveRuleDoubletonEquation]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDoubletonEquation);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 2);
  assert(model->row_lower_[row] == model->row_upper_[row]);

  // printf("doubleton equation: ");
  // debugPrintRow(row);
  HighsInt nzPos1 = rowroot[row];
  HighsInt nzPos2 = ARright[nzPos1] != -1 ? ARright[nzPos1] : ARleft[nzPos1];

  auto colAtPos1Better = [&]() {
    if (model->integrality_[Acol[nzPos1]] == HighsVarType::kInteger) {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // both columns integer. For substitution choose smaller absolute
        // coefficient value, or sparser column if values are equal
        if (std::fabs(Avalue[nzPos1]) <
            std::fabs(Avalue[nzPos2]) - options->small_matrix_value) {
          return true;
        } else if (std::fabs(Avalue[nzPos2]) <
                   std::fabs(Avalue[nzPos1]) - options->small_matrix_value) {
          return false;
        } else if (colsize[Acol[nzPos1]] < colsize[Acol[nzPos2]]) {
          return true;
        } else {
          return false;
        }
      } else {
        // one col is integral, substitute the continuous one
        return false;
      }
    } else {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // one col is integral, substitute the continuous one
        return true;
      } else {
        // both columns continuous the one with a larger absolute coefficient
        // value if the difference is more than factor 2, and otherwise the one
        // with fewer nonzeros if those are equal
        HighsInt col1Size = colsize[Acol[nzPos1]];
        if (col1Size == 1)
          return true;
        else {
          HighsInt col2Size = colsize[Acol[nzPos2]];
          if (col2Size == 1)
            return false;
          else {
            double abs1Val = std::fabs(Avalue[nzPos1]);
            double abs2Val = std::fabs(Avalue[nzPos2]);
            if (col1Size != col2Size &&
                std::max(abs1Val, abs2Val) <= 2.0 * std::min(abs1Val, abs2Val))
              return (col1Size < col2Size);
            else if (abs1Val > abs2Val)
              return true;
            else
              return false;
          }
        }
      }
    }
  };

  HighsInt substcol;
  HighsInt staycol;
  double substcoef;
  double staycoef;

  if (colAtPos1Better()) {
    substcol = Acol[nzPos1];
    staycol = Acol[nzPos2];

    substcoef = Avalue[nzPos1];
    staycoef = Avalue[nzPos2];
  } else {
    substcol = Acol[nzPos2];
    staycol = Acol[nzPos1];

    substcoef = Avalue[nzPos2];
    staycoef = Avalue[nzPos1];
  }

  double rhs = model->row_upper_[row];
  if (model->integrality_[substcol] == HighsVarType::kInteger &&
      model->integrality_[staycol] == HighsVarType::kInteger) {
    // check integrality conditions
    double roundCoef = std::round(staycoef / substcoef) * substcoef;
    if (std::fabs(roundCoef - staycoef) > options->small_matrix_value)
      return Result::kOk;
    staycoef = roundCoef;
    double roundRhs = std::round(rhs / substcoef) * substcoef;
    if (std::fabs(rhs - roundRhs) > primal_feastol)
      return Result::kPrimalInfeasible;
    rhs = roundRhs;
  }

  double oldStayLower = model->col_lower_[staycol];
  double oldStayUpper = model->col_upper_[staycol];
  double substLower = model->col_lower_[substcol];
  double substUpper = model->col_upper_[substcol];

  double stayImplLower;
  double stayImplUpper;
  if (std::signbit(substcoef) != std::signbit(staycoef)) {
    // coefficients have the opposite sign, therefore the implied lower bound of
    // the stay column is computed from the lower bound of the substituted
    // column:
    // staycol * staycoef + substcol * substcoef = rhs
    // staycol = (rhs - substcol * substcoef) / staycoef
    // staycol >= rhs / staycoef + lower(-substcoef/staycoef * substcol)
    // lower(-substcoef/staycoef * substcol) is (-substcoef/staycoef) *
    // substLower if (-substcoef/staycoef) is positive, i.e. if the coefficients
    // have opposite sign
    stayImplLower = substLower == -kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
    stayImplUpper = substUpper == kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
  } else {
    stayImplLower = substUpper == kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
    stayImplUpper = substLower == -kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
  }

  // possibly tighten bounds of the column that stays
  bool lowerTightened = stayImplLower > oldStayLower + primal_feastol;
  if (lowerTightened) changeColLower(staycol, stayImplLower);

  bool upperTightened = stayImplUpper < oldStayUpper - primal_feastol;
  if (upperTightened) changeColUpper(staycol, stayImplUpper);

  postsolve_stack.doubletonEquation(
      row, substcol, staycol, substcoef, staycoef, rhs, substLower, substUpper,
      model->col_cost_[substcol], lowerTightened, upperTightened, rowType,
      getColumnVector(substcol));

  // finally modify matrix
  markColDeleted(substcol);
  removeRow(row);
  substitute(substcol, staycol, rhs / substcoef, -staycoef / substcoef);

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDoubletonEquation);

  // since a column was deleted we might have new row singletons which we
  // immediately remove
  HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

  return checkLimits(postsolve_stack);
}